

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

size_t QHashPrivate::calculateHash<QLatin1String>(QLatin1String *t,size_t seed)

{
  size_t sVar1;
  
  sVar1 = qHash((QLatin1String *)t->m_size,(ulong)t->m_data);
  return sVar1;
}

Assistant:

size_t calculateHash(const T &t, size_t seed = 0)
{
    if constexpr (HasQHashOverload<T>) {
        return qHash(t, seed);
    } else if constexpr (HasStdHashSpecializationWithSeed<T>) {
        return std::hash<T>()(t, seed);
    } else if constexpr (HasStdHashSpecializationWithoutSeed<T>) {
        Q_UNUSED(seed);
        return std::hash<T>()(t);
    } else {
        static_assert(QtPrivate::type_dependent_false<T>(), "The key type must have a qHash overload or a std::hash specialization");
        return 0;
    }
}